

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O3

void __thiscall glslang::TParseContextBase::finish(TParseContextBase *this)

{
  pointer pbVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  TSymbol *pTVar5;
  undefined4 extraout_var;
  uint *puVar7;
  long lVar8;
  TPoolAllocator *this_00;
  TIntermAggregate *this_01;
  TTypeLoc *typeLoc;
  pointer ppTVar9;
  pointer name;
  uint unaff_R15D;
  TIntermAggregate *linkage;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  long *plVar6;
  
  if (this->parsingBuiltins == false) {
    name = (this->relaxedSymbols).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->relaxedSymbols).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (name != pbVar1) {
      do {
        pTVar5 = TSymbolTable::find(this->symbolTable,name,(bool *)0x0,(bool *)0x0,(int *)0x0);
        iVar4 = (*pTVar5->_vptr_TSymbol[0xd])(pTVar5);
        plVar6 = (long *)CONCAT44(extraout_var,iVar4);
        cVar3 = (**(code **)(*plVar6 + 0x128))(plVar6);
        if (cVar3 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        plVar2 = *(long **)(plVar6[0xd] + 0x10);
        for (plVar6 = *(long **)(plVar6[0xd] + 8); plVar6 != plVar2; plVar6 = plVar6 + 4) {
          cVar3 = (**(code **)(*(long *)*plVar6 + 0x140))();
          if (cVar3 != '\0') {
            unaff_R15D = unaff_R15D & 0x80000000;
            puVar7 = (uint *)(**(code **)(*(long *)*plVar6 + 0x48))();
            *puVar7 = unaff_R15D;
            *(undefined1 *)(*plVar6 + 8) = 8;
            local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_58,"/*","");
            lVar8 = (**(code **)(*(long *)*plVar6 + 0x30))();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(&local_58,*(char **)(lVar8 + 8),*(size_type *)(lVar8 + 0x10));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&local_58,"*/");
            (**(code **)(*(long *)*plVar6 + 0x20))((long *)*plVar6,&local_58);
          }
        }
        name = name + 1;
      } while (name != pbVar1);
    }
    this_00 = GetThreadPoolAllocator();
    this_01 = (TIntermAggregate *)TPoolAllocator::allocate(this_00,0x188);
    TIntermAggregate::TIntermAggregate(this_01);
    ppTVar9 = (this->linkageSymbols).
              super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
              super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_58._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this_01;
    if (ppTVar9 !=
        (this->linkageSymbols).
        super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
        super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      do {
        TIntermediate::addSymbolLinkageNode
                  ((this->super_TParseVersions).intermediate,(TIntermAggregate **)&local_58,*ppTVar9
                  );
        ppTVar9 = ppTVar9 + 1;
      } while (ppTVar9 !=
               (this->linkageSymbols).
               super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
               super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    TIntermediate::addSymbolLinkageNodes
              ((this->super_TParseVersions).intermediate,(TIntermAggregate **)&local_58,
               (this->super_TParseVersions).language,this->symbolTable);
  }
  return;
}

Assistant:

void TParseContextBase::finish()
{
    if (parsingBuiltins)
        return;

    for (const TString& relaxedSymbol : relaxedSymbols)
    {
        TSymbol* symbol = symbolTable.find(relaxedSymbol);
        TType& type = symbol->getWritableType();
        for (const TTypeLoc& typeLoc : *type.getStruct())
        {
            if (typeLoc.type->isOpaque())
            {
                typeLoc.type->getSampler() = TSampler{};
                typeLoc.type->setBasicType(EbtInt);
                TString fieldName("/*");
                fieldName.append(typeLoc.type->getFieldName());
                fieldName.append("*/");
                typeLoc.type->setFieldName(fieldName);
            }
        }
    }

    // Transfer the linkage symbols to AST nodes, preserving order.
    TIntermAggregate* linkage = new TIntermAggregate;
    for (auto i = linkageSymbols.begin(); i != linkageSymbols.end(); ++i)
        intermediate.addSymbolLinkageNode(linkage, **i);
    intermediate.addSymbolLinkageNodes(linkage, getLanguage(), symbolTable);
}